

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O0

Byte * z7_BranchConv_RISCV_Enc(Byte *p,SizeT size,UInt32 pc)

{
  Byte *pBVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  UInt32 r;
  int t;
  UInt32 temp;
  UInt32 b;
  UInt32 v;
  UInt32 a;
  Byte *lim;
  UInt32 pc_local;
  SizeT size_local;
  Byte *p_local;
  
  p_local = p;
  if (6 < (size & 0xfffffffffffffffe)) {
    iVar2 = pc - (int)p;
    pBVar1 = p;
LAB_001c5127:
    size_local = (SizeT)pBVar1;
    if (size_local < p + ((size & 0xfffffffffffffffe) - 6)) {
      b = (*(ushort *)size_local ^ 0x10) + 1;
      if ((b & 0x77) != 0) goto LAB_001c5169;
      goto LAB_001c51c9;
    }
    p_local = (Byte *)size_local;
  }
  return p_local;
LAB_001c5169:
  b = (*(ushort *)(size_local + 2) ^ 0x10) + 1;
  pBVar1 = (Byte *)(size_local + 4);
  if ((b & 0x77) == 0) {
    size_local = size_local + 2;
    if (p + ((size & 0xfffffffffffffffe) - 6) <= size_local) {
      return (Byte *)size_local;
    }
LAB_001c51c9:
    uVar5 = *(uint *)size_local;
    if ((b & 8) == 0) {
      if ((b - 0x100 & 0xd80) == 0) {
        uVar3 = iVar2 + (int)size_local +
                ((uVar5 & 0x80000000) >> 0xb | (uVar5 & 0x7fe00000) >> 0x14 |
                 (uVar5 & 0x100000) >> 9 | uVar5 & 0xff000);
        *(byte *)(size_local + 1) = (byte)(uVar3 >> 0xd) & 0xf0 | (byte)(uVar5 >> 8) & 0xf;
        iVar4 = uVar3 * 0x8000;
        *(ushort *)(size_local + 2) =
             (ushort)(byte)((uint)iVar4 >> 0x18) | (ushort)((uint)iVar4 >> 8) & 0xff00;
        pBVar1 = (Byte *)(size_local + 4);
      }
      else {
        pBVar1 = (Byte *)(size_local + 2);
      }
    }
    else if ((b & 0xe80) == 0) {
      if ((b - 0x3108) * 0x40000 < (uVar5 >> 0x1b & 0x1d)) {
        *(uint *)size_local =
             (uVar5 >> 0x1b) * 0x80 + 0x17 + (*(uint *)(size_local + 4) & 0xfffff000);
        *(uint *)(size_local + 4) = uVar5 >> 0xc | *(uint *)(size_local + 4) << 0x14;
        pBVar1 = (Byte *)(size_local + 8);
      }
      else {
        pBVar1 = (Byte *)(size_local + 4);
      }
    }
    else {
      iVar4 = *(int *)(size_local + 4);
      if (((iVar4 - 3U ^ b << 8) & 0xf8003) == 0) {
        *(uint *)size_local = iVar4 << 0xc | 0x117;
        uVar5 = iVar2 + (int)size_local + (iVar4 >> 0x14) + (uVar5 & 0xfffff000);
        *(uint *)(size_local + 4) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
        pBVar1 = (Byte *)(size_local + 8);
      }
      else {
        pBVar1 = (Byte *)(size_local + 6);
      }
    }
  }
  goto LAB_001c5127;
}

Assistant:

Byte * Z7_BRANCH_CONV_ENC(RISCV)(Byte *p, SizeT size, UInt32 pc)
{
  RISCV_SCAN_LOOP
    v = a;
    a = RISCV_GET_UI32(p);
#ifndef RISCV_USE_16BIT_LOAD
    v += (UInt32)p[1] << 8;
#endif

    if ((v & 8) == 0) // JAL
    {
      if ((v - (0x100 /* - RISCV_DELTA_7F */)) & 0xd80)
      {
        p += RISCV_INSTR_SIZE;
        continue;
      }
      {
        v = ((a &    1u << 31) >> 11)
          | ((a & 0x3ff << 21) >> 20)
          | ((a &     1 << 20) >> 9)
          |  (a &  0xff << 12);
        BR_CONVERT_VAL_ENC(v)
        // ((v & 1) == 0)
        // v: bits [1 : 20] contain offset bits
#if 0 && defined(RISCV_USE_UNALIGNED_LOAD)
        a &= 0xfff;
        a |= ((UInt32)(v << 23))
          |  ((UInt32)(v <<  7) & ((UInt32)0xff << 16))
          |  ((UInt32)(v >>  5) & ((UInt32)0xf0 << 8));
        RISCV_SET_UI32(p, a)
#else // aligned
#if 0
        SetUi16a(p, (UInt16)(((v >> 5) & 0xf000) | (a & 0xfff)))
#else
        p[1] = (Byte)(((v >> 13) & 0xf0) | ((a >> 8) & 0xf));
#endif

#if 1 && defined(Z7_CPU_FAST_BSWAP_SUPPORTED) && defined(MY_CPU_LE)
        v <<= 15;
        v = Z7_BSWAP32(v);
        SetUi16a(p + 2, (UInt16)v)
#else
        p[2] = (Byte)(v >> 9);
        p[3] = (Byte)(v >> 1);
#endif
#endif // aligned
      }
      p += 4;
      continue;
    } // JAL

    {
      // AUIPC
      if (v & 0xe80)  // (not x0) and (not x2)
      {
        const UInt32 b = RISCV_GET_UI32(p + 4);
        if (RISCV_CHECK_1(v, b))
        {
          {
            const UInt32 temp = (b << 12) | (0x17 + RISCV_REG_VAL);
            RISCV_SET_UI32(p, temp)
          }
          a &= 0xfffff000;
          {
#if 1
          const int t = -1 >> 1;
          if (t != -1)
            a += (b >> 20) - ((b >> 19) & 0x1000); // arithmetic right shift emulation
          else
#endif
            a += (UInt32)((Int32)b >> 20); // arithmetic right shift (sign-extension).
          }
          BR_CONVERT_VAL_ENC(a)
#if 1 && defined(Z7_CPU_FAST_BSWAP_SUPPORTED) && defined(MY_CPU_LE)
          a = Z7_BSWAP32(a);
          RISCV_SET_UI32(p + 4, a)
#else
          SetBe32(p + 4, a)
#endif
          p += 8;
        }
        else
          p += RISCV_STEP_1;
      }
      else
      {
        UInt32 r = a >> 27;
        if (RISCV_CHECK_2(v, r))
        {
          v = RISCV_GET_UI32(p + 4);
          r = (r << 7) + 0x17 + (v & 0xfffff000);
          a = (a >> 12) | (v << 20);
          RISCV_SET_UI32(p, r)
          RISCV_SET_UI32(p + 4, a)
          p += 8;
        }
        else
          p += RISCV_STEP_2;
      }
    }
  }